

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::
MatchExpr<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_EigenIsApprox<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
::streamReconstructedExpression
          (MatchExpr<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_EigenIsApprox<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
           *this,ostream *os)

{
  __type _Var1;
  ostream *poVar2;
  Matrix<float,__1,_1,_0,__1,_1> *value;
  string matcherAsString;
  type local_30;
  
  Matchers::Impl::MatcherUntypedBase::toString_abi_cxx11_
            ((string *)&matcherAsString,(MatcherUntypedBase *)&this->m_matcher);
  StringMaker<Eigen::Matrix<float,-1,1,0,-1,1>,void>::convert<Eigen::Matrix<float,_1,1,0,_1,1>>
            (&local_30,(StringMaker<Eigen::Matrix<float,_1,1,0,_1,1>,void> *)this->m_arg,value);
  poVar2 = std::operator<<((ostream *)os,(string *)&local_30);
  std::operator<<(poVar2,' ');
  std::__cxx11::string::~string((string *)&local_30);
  _Var1 = std::operator==(&matcherAsString,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          Detail::unprintableString_abi_cxx11_);
  if (_Var1) {
    Catch::operator<<((ostream *)os,&this->m_matcherString);
  }
  else {
    std::operator<<((ostream *)os,(string *)&matcherAsString);
  }
  std::__cxx11::string::~string((string *)&matcherAsString);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            auto matcherAsString = m_matcher.toString();
            os << Catch::Detail::stringify( m_arg ) << ' ';
            if( matcherAsString == Detail::unprintableString )
                os << m_matcherString;
            else
                os << matcherAsString;
        }